

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint port;
  long lVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char *endp;
  string proxyhost;
  UdpListeningReceiveSocket s;
  ProxyListener listener;
  char *local_4c0;
  string local_4b8;
  UdpListeningReceiveSocket local_498;
  IpEndpointName local_478;
  ProxyListener local_468;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"OscProxy listenport [proxyhost proxyport]",0x29);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    return -1;
  }
  lVar2 = strtol(argv[1],&local_4c0,10);
  paVar1 = &local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  local_4b8._M_dataplus._M_p = (pointer)paVar1;
  if (argc != 2) {
    pcVar5 = argv[2];
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,(ulong)pcVar5);
  }
  uVar3 = (uint)lVar2;
  port = uVar3;
  if (3 < argc) {
    lVar2 = strtol(argv[3],&local_4c0,10);
    port = (uint)lVar2;
  }
  if (uVar3 == 0) {
    lVar2 = 0x12;
    pcVar5 = "invalid listenport";
  }
  else {
    if (port != 0) {
      ProxyListener::ProxyListener(&local_468,&local_4b8,port);
      local_478.address = 0xffffffff;
      local_478.port = uVar3;
      UdpListeningReceiveSocket::UdpListeningReceiveSocket
                (&local_498,&local_478,(PacketListener *)&local_468);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"press ctrl-c to end",0x13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
      SocketReceiveMultiplexer::RunUntilSigInt(&local_498.mux_);
      UdpListeningReceiveSocket::~UdpListeningReceiveSocket(&local_498);
      local_468.super_OscPacketListener.super_PacketListener._vptr_PacketListener =
           (PacketListener)&PTR__ProxyListener_0010c958;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_468.host_._M_dataplus._M_p != &local_468.host_.field_2) {
        operator_delete(local_468.host_._M_dataplus._M_p);
      }
      if (local_468.proxy_.super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_468.proxy_.
                   super___shared_ptr<UdpTransmitSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      iVar4 = 0;
      goto LAB_001036f5;
    }
    lVar2 = 0x11;
    pcVar5 = "invalid proxyport";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
  std::ostream::put('\b');
  iVar4 = -1;
  std::ostream::flush();
LAB_001036f5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[]) {
    (void) argc; // suppress unused parameter warnings
    (void) argv; // suppress unused parameter warnings
    if (argc < 2) {
        std::cerr << "OscProxy listenport [proxyhost proxyport]" << std::endl;
        return -1;
    }
    char *endp;
    auto listenport = (unsigned) std::strtol(argv[1], &endp, 10);

    std::string proxyhost;
    if (argc > 2) proxyhost = argv[2];

    unsigned proxyport = listenport;
    if (argc > 3) proxyport =  (unsigned) std::strtol(argv[3], &endp, 10);

    if (listenport == 0) {
        std::cerr << "invalid listenport" << std::endl;
        return -1;
    }

    if (proxyport == 0) {
        std::cerr << "invalid proxyport" << std::endl;
        return -1;
    }

    ProxyListener listener(proxyhost, proxyport);

    UdpListeningReceiveSocket s(
            IpEndpointName(IpEndpointName::ANY_ADDRESS, listenport),
            &listener);

    std::cout << "press ctrl-c to end" << std::endl;

    s.RunUntilSigInt();

    return 0;
}